

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall flow::lang::UnitSym::UnitSym(UnitSym *this)

{
  allocator<char> local_69;
  string local_68;
  SourceLocation local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"#unit",&local_69);
  local_48.filename._M_dataplus._M_p = (pointer)&local_48.filename.field_2;
  local_48.filename._M_string_length = 0;
  local_48.filename.field_2._M_local_buf[0] = '\0';
  local_48.begin.line = 1;
  local_48.begin.column = 1;
  local_48.begin.offset = 0;
  local_48.end.line = 1;
  local_48.end.column = 1;
  local_48.end.offset = 0;
  ScopedSym::ScopedSym(&this->super_ScopedSym,Unit,(SymbolTable *)0x0,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_ScopedSym).super_Symbol.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR__UnitSym_00193b88;
  (this->modules_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modules_).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UnitSym()
      : ScopedSym(Symbol::Unit, nullptr, "#unit", SourceLocation()),
        modules_() {}